

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O1

void __thiscall TestMakeCmakeComment_Multiline::Run(TestMakeCmakeComment_Multiline *this)

{
  int iVar1;
  runtime_error *this_00;
  string comment;
  string expectedComment;
  string contents;
  string local_88;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Multiple\nlines\nin\ncomment","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"# Multiple\n# lines\n# in\n# comment\n","");
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  MakeCmakeComment(&local_88,&local_48);
  if (local_88._M_string_length == local_60) {
    if (local_88._M_string_length != 0) {
      iVar1 = bcmp(local_88._M_dataplus._M_p,local_68,local_88._M_string_length);
      if (iVar1 != 0) goto LAB_00115f1a;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
LAB_00115f1a:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: comment == expectedComment");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeTargetLinkLibraries_PublicPrivate) {
  bool isHeaderOnly = false;
  const std::set<std::string> publicDeps{
    "ComponentA",
    "ComponentB"
  };
  const std::set<std::string> privateDeps{
    "ComponentZ",
    "ComponentY"
  };

  const std::string expectedOutput(
      "target_link_libraries(${PROJECT_NAME}\n"
      "  PUBLIC\n"
      "    ComponentA\n"
      "    ComponentB\n"
      "  PRIVATE\n"
      "    ComponentY\n"
      "    ComponentZ\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeTargetLinkLibraries(oss, publicDeps, privateDeps, isHeaderOnly);

  ASSERT(oss.str() == expectedOutput);
}